

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

bov_points_t * bov_points_update(bov_points_t *points,GLfloat (*coords) [2],GLsizei n)

{
  GLsizei GVar1;
  
  GVar1 = 0;
  if (coords != (GLfloat (*) [2])0x0) {
    GVar1 = n;
  }
  points->vboLen = GVar1;
  (*glad_glBindBuffer)(0x8892,points->vbo);
  if (points->vboCapacity < n) {
    (*glad_glBufferData)(0x8892,(long)n << 3,coords,0x88e8);
    points->vboCapacity = n;
  }
  else if (coords != (GLfloat (*) [2])0x0) {
    (*glad_glBufferSubData)(0x8892,0,(long)n << 3,coords);
  }
  return points;
}

Assistant:

bov_points_t* bov_points_update(bov_points_t* points,
                                const GLfloat coords[][2],
                                GLsizei n)
{
	points->vboLen = coords==NULL ? 0 : n;

	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);
	if(n > points->vboCapacity) {
		glBufferData(GL_ARRAY_BUFFER, sizeof(GLfloat) * 2 * n, coords,
		             GL_DYNAMIC_DRAW);
		points->vboCapacity = n;
	}
	else if(coords!=NULL) {
		glBufferSubData(GL_ARRAY_BUFFER,
		                0,
		                sizeof(GLfloat) * 2 * n,
		                coords);
	}
	// glBindBuffer(GL_ARRAY_BUFFER, 0);

	return points;
}